

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapelinear.cpp
# Opt level: O1

void pzshape::TPZShapeLinear::TransformPoint1d(int transid,FADREAL *in,FADREAL *out)

{
  uint uVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  ulong uVar5;
  
  if (transid == 0) {
    out->val_ = in->val_;
    Vector<double>::operator=(&out->dx_,&in->dx_);
    out->defaultVal = in->defaultVal;
  }
  else {
    uVar1 = (in->dx_).num_elts;
    uVar2 = (out->dx_).num_elts;
    if (uVar1 != uVar2) {
      if (uVar1 == 0) {
        if (uVar2 != 0) {
          pdVar4 = (out->dx_).ptr_to_data;
          if (pdVar4 != (double *)0x0) {
            operator_delete__(pdVar4);
          }
          (out->dx_).num_elts = 0;
          (out->dx_).ptr_to_data = (double *)0x0;
        }
      }
      else {
        if (uVar2 != 0) {
          pdVar4 = (out->dx_).ptr_to_data;
          if (pdVar4 != (double *)0x0) {
            operator_delete__(pdVar4);
          }
          (out->dx_).num_elts = 0;
          (out->dx_).ptr_to_data = (double *)0x0;
        }
        (out->dx_).num_elts = uVar1;
        uVar5 = 0xffffffffffffffff;
        if (-1 < (int)uVar1) {
          uVar5 = (long)(int)uVar1 << 3;
        }
        pdVar4 = (double *)operator_new__(uVar5);
        (out->dx_).ptr_to_data = pdVar4;
      }
    }
    if (uVar1 != 0) {
      pdVar4 = (out->dx_).ptr_to_data;
      if ((in->dx_).num_elts == 0) {
        if (0 < (int)uVar1) {
          uVar5 = 0;
          do {
            pdVar4[uVar5] = -in->defaultVal;
            uVar5 = uVar5 + 1;
          } while (uVar1 != uVar5);
        }
      }
      else if (0 < (int)uVar1) {
        pdVar3 = (in->dx_).ptr_to_data;
        uVar5 = 0;
        do {
          pdVar4[uVar5] = -pdVar3[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar1 != uVar5);
      }
    }
    out->val_ = -in->val_;
  }
  return;
}

Assistant:

void TPZShapeLinear::TransformPoint1d(int transid,FADREAL & in,FADREAL &out) {
		if (!transid) out =  in;
		else          out = -in;
	}